

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall deqp::gls::BuiltinPrecisionTests::Functions::ATan::~ATan(ATan *this)

{
  ATan *this_local;
  
  ~ATan(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

ATan (void) : ArcTrigFunc("atan", deAtanOver, 4096.0,
							  Interval::unbounded(),
							  Interval(-DE_PI_DOUBLE * 0.5, DE_PI_DOUBLE * 0.5)) {}